

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float value;
  double value_00;
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  LogMessage *other;
  unsigned_long i;
  char *pcVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  do {
    TVar2 = FieldDescriptor::type(descriptor);
    switch(TVar2) {
    case TYPE_DOUBLE:
      value_00 = *(double *)(descriptor + 0xa0);
      if (INFINITY <= value_00) {
        pcVar4 = "double.PositiveInfinity";
      }
      else if (value_00 <= -INFINITY) {
        pcVar4 = "double.NegativeInfinity";
      }
      else {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_((string *)&local_50,(protobuf *)this,value_00);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50,"D");
LAB_00287d1f:
          std::__cxx11::string::~string((string *)&local_50);
          return __return_storage_ptr__;
        }
        pcVar4 = "double.NaN";
      }
LAB_00287d5f:
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_50);
      return __return_storage_ptr__;
    case TYPE_FLOAT:
      value = *(float *)(descriptor + 0xa0);
      if (INFINITY <= value) {
        pcVar4 = "float.PositiveInfinity";
        goto LAB_00287d5f;
      }
      if (value <= -INFINITY) {
        pcVar4 = "float.NegativeInfinity";
        goto LAB_00287d5f;
      }
      if (NAN(value)) {
        pcVar4 = "float.NaN";
        goto LAB_00287d5f;
      }
      SimpleFtoa_abi_cxx11_((string *)&local_50,(protobuf *)this,value);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     "F");
      goto LAB_00287d1f;
    case TYPE_INT64:
      SimpleItoa_abi_cxx11_((string *)&local_50,*(protobuf **)(descriptor + 0xa0),i);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     "L");
      goto LAB_00287d1f;
    case TYPE_UINT64:
      SimpleItoa_abi_cxx11_((string *)&local_50,*(protobuf **)(descriptor + 0xa0),i);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     "UL");
      goto LAB_00287d1f;
    case TYPE_INT32:
    case TYPE_SFIXED32:
    case TYPE_SINT32:
      SimpleItoa_abi_cxx11_
                (__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(descriptor + 0xa0),(uint)i);
      return __return_storage_ptr__;
    case TYPE_FIXED64:
      SimpleItoa_abi_cxx11_((string *)&local_50,*(protobuf **)(descriptor + 0xa0),i);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     "UL");
      goto LAB_00287d1f;
    case TYPE_FIXED32:
    case TYPE_UINT32:
      SimpleItoa_abi_cxx11_
                (__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(descriptor + 0xa0),(uint)i);
      return __return_storage_ptr__;
    case TYPE_BOOL:
      if (descriptor[0xa0] == (FieldDescriptor)0x1) {
        pcVar4 = "true";
      }
      else {
        pcVar4 = "false";
      }
      goto LAB_00287d5f;
    case TYPE_STRING:
      GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case TYPE_GROUP:
    case TYPE_MESSAGE:
      bVar1 = IsWrapperType(descriptor);
      if (!bVar1) {
        pcVar4 = "null";
        goto LAB_00287d5f;
      }
      pDVar3 = FieldDescriptor::message_type(descriptor);
      descriptor = *(FieldDescriptor **)(pDVar3 + 0x30);
      break;
    case TYPE_BYTES:
      GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case TYPE_ENUM:
      pcVar4 = "0";
      goto LAB_00287d5f;
    case TYPE_SFIXED64:
      SimpleItoa_abi_cxx11_((string *)&local_50,*(protobuf **)(descriptor + 0xa0),i);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     "L");
      goto LAB_00287d1f;
    case MAX_TYPE:
      SimpleItoa_abi_cxx11_((string *)&local_50,*(protobuf **)(descriptor + 0xa0),i);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     "L");
      goto LAB_00287d1f;
    default:
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
                 ,0x178);
      other = internal::LogMessage::operator<<(&local_50,"Unknown field type.");
      internal::LogFinisher::operator=(&local_51,other);
      internal::LogMessage::~LogMessage(&local_50);
      pcVar4 = "";
      goto LAB_00287d5f;
    }
  } while( true );
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      // All proto3 enums have a default value of 0, and there's an implicit conversion from the constant 0 to
      // any C# enum. This means we don't need to work out what we actually mapped the enum value name to.
     return "0";
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (MathLimits<double>::IsNaN(value)) {
        return "double.NaN";
      }
      return SimpleDtoa(value) + "D";
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (MathLimits<float>::IsNaN(value)) {
        return "float.NaN";
      }
      return SimpleFtoa(value) + "F";
    }
    case FieldDescriptor::TYPE_INT64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_UINT64:
      return SimpleItoa(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_INT32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return SimpleItoa(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_FIXED32:
      return SimpleItoa(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal();
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal();
    case FieldDescriptor::TYPE_UINT32:
      return SimpleItoa(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_SINT32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}